

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O2

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
          (Registry *this,uint64_t aXpan,Network *aRet)

{
  Status SVar1;
  Network nwk;
  Network local_80;
  
  Network::Network(&local_80);
  local_80.mXpan = aXpan;
  SVar1 = LookupOne(this,&local_80,aRet);
  Network::~Network(&local_80);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByXpan(uint64_t aXpan, Network &aRet)
{
    Network nwk{};
    nwk.mXpan = aXpan;
    return LookupOne(nwk, aRet);
}